

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O2

void TestEq<unsigned_long,unsigned_int>
               (unsigned_long expval,uint val,char *exp,char *file,int line,char *func)

{
  string local_70;
  string local_50;
  
  if ((uint)expval != val) {
    flatbuffers::NumToString<unsigned_long>(&local_50,expval);
    flatbuffers::NumToString<unsigned_int>(&local_70,val);
    TestFail(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,exp,file,line,func);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}